

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

void __thiscall
QSQLiteDriver::QSQLiteDriver(QSQLiteDriver *this,sqlite3 *connection,QObject *parent)

{
  QSQLiteDriverPrivate *pQVar1;
  QObject *in_RDX;
  sqlite3 *in_RSI;
  QSqlDriver *in_RDI;
  QSQLiteDriverPrivate *d;
  
  pQVar1 = (QSQLiteDriverPrivate *)operator_new(0xe0);
  QSQLiteDriverPrivate::QSQLiteDriverPrivate(pQVar1);
  QSqlDriver::QSqlDriver(in_RDI,(QSqlDriverPrivate *)pQVar1,in_RDX);
  *(undefined ***)in_RDI = &PTR_metaObject_002e3330;
  pQVar1 = d_func((QSQLiteDriver *)0x117054);
  pQVar1->access = in_RSI;
  (**(code **)(*(long *)in_RDI + 0x110))(in_RDI,1);
  (**(code **)(*(long *)in_RDI + 0x118))(in_RDI,0);
  return;
}

Assistant:

QSQLiteDriver::QSQLiteDriver(sqlite3 *connection, QObject *parent)
    : QSqlDriver(*new QSQLiteDriverPrivate, parent)
{
    Q_D(QSQLiteDriver);
    d->access = connection;
    setOpen(true);
    setOpenError(false);
}